

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O3

T4_A * __thiscall di::Context::get<T4_A>(Context *this)

{
  undefined1 auVar1 [16];
  CtxItem *this_00;
  long *plVar2;
  undefined8 *puVar3;
  long *in_RCX;
  undefined1 auVar4 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  long lStack_30;
  
  this_00 = getItem<T4_A>(this);
  if ((T4_A *)this_00->instancePtr != (T4_A *)0x0) {
    return (T4_A *)this_00->instancePtr;
  }
  if (this_00->marker == true) {
    this_00 = (CtxItem *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Cyclic dependecy while instantiating type: ","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
    auVar1._8_8_ = &local_38;
    auVar1._0_8_ = plVar2;
    auVar4._8_8_ = (long *)*plVar2;
    auVar4._0_8_ = plVar2;
    in_RCX = plVar2 + 2;
    if ((long *)*plVar2 == in_RCX) {
      local_38 = *in_RCX;
      lStack_30 = plVar2[3];
      goto LAB_0010c8e9;
    }
  }
  else {
    this_00->marker = true;
    if ((this_00->factory).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this_00->factory)._M_invoker)((_Any_data *)&this_00->factory);
      this_00->marker = false;
      return (T4_A *)this_00->instancePtr;
    }
    auVar4 = std::__throw_bad_function_call();
  }
  local_38 = *in_RCX;
  auVar1 = auVar4;
LAB_0010c8e9:
  local_48 = auVar1._8_8_;
  puVar3 = auVar1._0_8_;
  local_40 = puVar3[1];
  *puVar3 = in_RCX;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T& get()
    {
        CtxItem& item = getItem<T>(); // may return derived type

        if (item.instancePtr == nullptr)
        {
            if (item.marker)
                throw std::runtime_error(std::string("Cyclic dependecy while instantiating type: ") + typeid(T).name());

            item.marker = true;
            item.factory();
            item.marker = false;
        }

        return *(static_cast<T*>(item.instancePtr));
    }